

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_equivalentUnitsMatchingBuiltinUnitsFromVariable_Test::
~Units_equivalentUnitsMatchingBuiltinUnitsFromVariable_Test
          (Units_equivalentUnitsMatchingBuiltinUnitsFromVariable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, equivalentUnitsMatchingBuiltinUnitsFromVariable)
{
    libcellml::ModelPtr model = libcellml::Model::create("unit_compatible_test");

    libcellml::VariablePtr variable = libcellml::Variable::create("T");
    libcellml::UnitsPtr units = libcellml::Units::create("kelvin");
    units->addUnit(libcellml::Units::StandardUnit::KELVIN);

    model->addUnits(units);
    variable->setUnits(units);

    libcellml::VariablePtr variableParam = variable->clone();

    EXPECT_TRUE(libcellml::Units::compatible(variable->units(), variableParam->units()));
}